

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ClassEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  EncodedChar **p;
  EncodedChar *pEVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  OLECHAR OVar8;
  Char CVar9;
  undefined4 *puVar10;
  byte *last;
  ulong uVar11;
  CharCount n;
  uint uVar12;
  byte *pbVar13;
  int iVar14;
  uint uVar15;
  
  p = &this->next;
  pbVar13 = this->next;
  if (this->inputLim < pbVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00edc626;
    *puVar10 = 0;
    pbVar13 = *p;
  }
  uVar11 = (ulong)*pbVar13;
  if ((uVar11 == 0) && (this->inputLim <= pbVar13)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  if ((ASCIIChars::classes[uVar11] & 0x20) != 0) {
    iVar14 = 3;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar12 = 0;
    do {
      if (this->inputLim < pbVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00edc626;
        *puVar10 = 0;
        pbVar13 = *p;
        uVar11 = (ulong)*pbVar13;
      }
      bVar4 = (byte)uVar11;
      uVar15 = (uint)(byte)ASCIIChars::values[uVar11] + uVar12 * 8;
      if (0xff < uVar15) break;
      if (this->inputLim < pbVar13 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00edc626;
        *puVar10 = 0;
        pbVar13 = *p;
        bVar4 = *pbVar13;
      }
      if ((char)bVar4 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar3) goto LAB_00edc626;
        *puVar10 = 0;
        pbVar13 = *p;
      }
      pbVar13 = pbVar13 + 1;
      *p = pbVar13;
      iVar14 = iVar14 + -1;
      uVar12 = uVar15;
      if (iVar14 == 0) break;
      if (this->inputLim < pbVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00edc626;
        *puVar10 = 0;
        pbVar13 = *p;
      }
      uVar11 = (ulong)*pbVar13;
    } while ((ASCIIChars::classes[uVar11] & 0x20) != 0);
    *singleton = (Char)uVar12;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    goto LAB_00edc24d;
  }
  last = this->inputLim;
  pEVar1 = this->tempLocationOfSurrogatePair;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  if (last <= pbVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar3) goto LAB_00edc626;
    *puVar10 = 0;
    last = this->inputLim;
  }
  OVar8 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                    (&this->super_UTF8EncodingPolicyBase<false>,p,last);
  if ((ushort)OVar8 < 0x100) {
    if ((ASCIIChars::classes[(ushort)OVar8] & 2) != 0) {
LAB_00edc1f7:
      Fail(this,-0x7ff5fc0c);
    }
  }
  else if ((OVar8 & 0xfffeU) == 0x2028) goto LAB_00edc1f7;
  bVar3 = false;
  if ((ushort)OVar8 < 0x62) {
    if (OVar8 == L'D') {
      return false;
    }
    if (OVar8 == L'S') {
      return false;
    }
    if (OVar8 == L'W') {
      return false;
    }
switchD_00edc22a_caseD_65:
    *singleton = OVar8;
  }
  else {
    switch(OVar8) {
    case L'b':
      *singleton = L'\b';
      break;
    case L'c':
      pbVar13 = this->next;
      if (this->inputLim < pbVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00edc626;
        *puVar10 = 0;
        pbVar13 = *p;
      }
      if ((ASCIIChars::classes[*pbVar13] & 8) == 0) {
        DeferredFailIfUnicode(this,-0x7ff5e9d6);
        pbVar13 = this->next;
      }
      if (this->inputLim < pbVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) {
LAB_00edc626:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar10 = 0;
        pbVar13 = *p;
      }
      if ((ASCIIChars::classes[*pbVar13] & 1) == 0) {
        ECRevert(this,1);
        *singleton = L'\\';
      }
      else {
        bVar4 = ECLookahead(this,0);
        CVar9 = Chars<char16_t>::UTC((uint)(bVar4 & 0x1f));
        *singleton = CVar9;
        n = 1;
LAB_00edc55f:
        ECConsume(this,n);
      }
      break;
    case L'd':
    case L's':
    case L'w':
      goto switchD_00edc22a_caseD_64;
    default:
      goto switchD_00edc22a_caseD_65;
    case L'f':
      *singleton = L'\f';
      break;
    case L'n':
      *singleton = L'\n';
      break;
    case L'r':
      *singleton = L'\r';
      break;
    case L't':
      *singleton = L'\t';
      break;
    case L'u':
      this->tempLocationOfSurrogatePair = pEVar1;
      iVar14 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
      if (0 < iVar14) {
        return true;
      }
      if (((this->next + 4 <= this->inputLim) &&
          (bVar4 = ECLookahead(this,0), (ASCIIChars::classes[bVar4] & 0x40) != 0)) &&
         ((bVar4 = ECLookahead(this,1), (ASCIIChars::classes[bVar4] & 0x40) != 0 &&
          ((bVar4 = ECLookahead(this,2), (ASCIIChars::classes[bVar4] & 0x40) != 0 &&
           (bVar4 = ECLookahead(this,3), (ASCIIChars::classes[bVar4] & 0x40) != 0)))))) {
        bVar4 = ECLookahead(this,0);
        bVar4 = ASCIIChars::values[bVar4];
        bVar5 = ECLookahead(this,1);
        bVar5 = ASCIIChars::values[bVar5];
        bVar6 = ECLookahead(this,2);
        bVar6 = ASCIIChars::values[bVar6];
        bVar7 = ECLookahead(this,3);
        CVar9 = Chars<char16_t>::UTC
                          ((uint)(byte)ASCIIChars::values[bVar7] | (uint)bVar6 << 4 |
                           (uint)bVar5 << 8 | (uint)bVar4 << 0xc);
        *singleton = CVar9;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          TrackIfSurrogatePair(this,(uint)(ushort)CVar9,this->next + -1,5);
        }
        ECConsume(this,4);
        return true;
      }
      *singleton = L'u';
      return true;
    case L'v':
      *singleton = L'\v';
      break;
    case L'x':
      if (((this->next + 2 <= this->inputLim) &&
          (bVar4 = ECLookahead(this,0), (ASCIIChars::classes[bVar4] & 0x40) != 0)) &&
         (bVar4 = ECLookahead(this,1), (ASCIIChars::classes[bVar4] & 0x40) != 0)) {
        bVar4 = ECLookahead(this,0);
        bVar4 = ASCIIChars::values[bVar4];
        bVar5 = ECLookahead(this,1);
        CVar9 = Chars<char16_t>::UTC((uint)(byte)ASCIIChars::values[bVar5] | (uint)bVar4 << 4);
        *singleton = CVar9;
        n = 2;
        goto LAB_00edc55f;
      }
      *singleton = L'x';
    }
  }
LAB_00edc24d:
  bVar3 = true;
switchD_00edc22a_caseD_64:
  return bVar3;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }